

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

ProStringList * __thiscall
QMap<ProKey,_ProStringList>::value
          (ProStringList *__return_storage_ptr__,QMap<ProKey,_ProStringList> *this,ProKey *key,
          ProStringList *defaultValue)

{
  QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  qsizetype qVar3;
  _Base_ptr p_Var4;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                 *)0x0) {
    cVar2 = std::
            _Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
            ::find(&(pQVar1->m)._M_t,key);
    if ((_Rb_tree_header *)cVar2._M_node !=
        &(((this->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      p_Var4 = cVar2._M_node[2]._M_left;
      (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)p_Var4;
      (__return_storage_ptr__->super_QList<ProString>).d.ptr =
           (ProString *)cVar2._M_node[2]._M_right;
      qVar3 = *(qsizetype *)(cVar2._M_node + 3);
      goto LAB_0016165b;
    }
  }
  p_Var4 = (_Base_ptr)(defaultValue->super_QList<ProString>).d.d;
  (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)p_Var4;
  (__return_storage_ptr__->super_QList<ProString>).d.ptr =
       (defaultValue->super_QList<ProString>).d.ptr;
  qVar3 = (defaultValue->super_QList<ProString>).d.size;
LAB_0016165b:
  (__return_storage_ptr__->super_QList<ProString>).d.size = qVar3;
  if (p_Var4 != (_Base_ptr)0x0) {
    LOCK();
    p_Var4->_M_color = p_Var4->_M_color + _S_black;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }